

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_uint64_192(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  block_t *in_RDX;
  ulong *in_RSI;
  block_t *in_RDI;
  word mask;
  uint i;
  word idx;
  uint w;
  block_t *Ablock;
  word *vptr;
  block_t *cblock;
  int local_44;
  ulong local_40;
  int local_34;
  block_t *local_30;
  ulong *local_28;
  
  local_30 = in_RDX;
  local_28 = in_RSI;
  for (local_34 = 3; local_34 != 0; local_34 = local_34 + -1) {
    local_40 = *local_28;
    for (local_44 = 0x40; local_44 != 0; local_44 = local_44 + -1) {
      mzd_xor_mask_uint64_block(in_RDI,local_30,-(local_40 & 1),3);
      local_40 = local_40 >> 1;
      local_30 = local_30 + 1;
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void mzd_addmul_v_uint64_192(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  for (unsigned int w = 3; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; --i, idx >>= 1, ++Ablock) {
      const word mask = -(idx & 1);
      mzd_xor_mask_uint64_block(cblock, Ablock, mask, 3);
    }
  }
}